

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O2

void __thiscall ThreadRegion::printNodes(ThreadRegion *this,ostream *ostream)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string local_40;
  
  poVar1 = std::operator<<(ostream,"subgraph ");
  dotName_abi_cxx11_(&local_40,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1," {\n");
  std::__cxx11::string::_M_dispose();
  std::operator<<(ostream,"color = blue\n style = rounded\n");
  for (p_Var2 = (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->nodes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    Node::dump_abi_cxx11_(&local_40,*(Node **)(p_Var2 + 1));
    std::operator<<(ostream,(string *)&local_40);
    std::__cxx11::string::_M_dispose();
  }
  std::operator<<(ostream,"}\n");
  return;
}

Assistant:

void ThreadRegion::printNodes(std::ostream &ostream) {
    ostream << "subgraph " << dotName() << " {\n";
    ostream << "color = blue\n style = rounded\n";
    for (const auto &node : nodes_) {
        ostream << node->dump();
    }
    ostream << "}\n";
}